

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

void __thiscall CCoinsViewDB::ResizeCache(CCoinsViewDB *this,size_t new_cache_size)

{
  long lVar1;
  CDBWrapper *in_RSI;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *in_RDI;
  long in_FS_OFFSET;
  DBParams *unaff_retaddr;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[7]._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
              _M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
              super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl & 1) == 0) {
    this_00 = in_RDI;
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset(in_RDI,(pointer)0x757080);
    in_RDI[6]._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
    super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
    super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl = in_RSI;
    *(undefined1 *)
     ((long)&in_RDI[7]._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
             .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
             super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 1) = 0;
    std::make_unique<CDBWrapper,DBParams&>(unaff_retaddr);
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator=
              (this_00,(unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_RSI);
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewDB::ResizeCache(size_t new_cache_size)
{
    // We can't do this operation with an in-memory DB since we'll lose all the coins upon
    // reset.
    if (!m_db_params.memory_only) {
        // Have to do a reset first to get the original `m_db` state to release its
        // filesystem lock.
        m_db.reset();
        m_db_params.cache_bytes = new_cache_size;
        m_db_params.wipe_data = false;
        m_db = std::make_unique<CDBWrapper>(m_db_params);
    }
}